

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intUtil.c
# Opt level: O1

int Inter_ManCheckAllStates(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  long lVar3;
  long lVar4;
  int level;
  uint uVar5;
  timespec ts;
  timespec local_38;
  
  iVar1 = clock_gettime(3,&local_38);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  p_00 = Cnf_Derive(p,p->nRegs);
  uVar5 = 1;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  Cnf_DataFree(p_00);
  if (s != (sat_solver *)0x0) {
    iVar1 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    sat_solver_delete(s);
    Abc_Print((int)s,"%s =","Time");
    level = 3;
    iVar2 = clock_gettime(3,&local_38);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
    uVar5 = (uint)(iVar1 == -1);
  }
  return uVar5;
}

Assistant:

int Inter_ManCheckAllStates( Aig_Man_t * p )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int status;
    abctime clk = Abc_Clock();
    pCnf = Cnf_Derive( p, Saig_ManRegNum(p) ); 
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    Cnf_DataFree( pCnf );
    if ( pSat == NULL )
        return 1;
    status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    sat_solver_delete( pSat );
    ABC_PRT( "Time", Abc_Clock() - clk );
    return status == l_False;
}